

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O0

void __thiscall
SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int>::
SparseArray_IndexInitializationListCtorCheck_Test
          (SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int> *this)

{
  SparseArray_IndexInitializationListCtorCheck_Test<unsigned_int> *this_local;
  
  anon_unknown.dwarf_92f3e::SparseArray<unsigned_int>::SparseArray
            (&this->super_SparseArray<unsigned_int>);
  (this->super_SparseArray<unsigned_int>).super_Test._vptr_Test =
       (_func_int **)&PTR__SparseArray_IndexInitializationListCtorCheck_Test_00352160;
  return;
}

Assistant:

TYPED_TEST (SparseArray, IndexInitializationListCtorCheck) {
    ctor_counter::ctors = 0;

    auto arrp = sparse_array<ctor_counter, TypeParam>::make_unique ({0, 2, 4});
    auto & arr = *arrp;
    EXPECT_EQ (arr[0].v, 0U);
    EXPECT_EQ (arr[2].v, 1U);
    EXPECT_EQ (arr[4].v, 2U);
}